

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserAdams.cpp
# Opt level: O2

void __thiscall chrono::utils::ChParserAdams::Report::Print(Report *this)

{
  ostream *poVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChBodyAuxRef>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChBodyAuxRef>_>_>_>
  *__range2;
  long *plVar2;
  __node_base *p_Var3;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Parsed ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," bodies:\n");
  p_Var3 = &(this->bodies)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"   name: \"");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var3 + 1));
    poVar1 = std::operator<<(poVar1,"\"");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Parsed ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," joints:\n");
  plVar2 = (long *)&this->field_0x48;
  while (plVar2 = (long *)*plVar2, plVar2 != (long *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"   name: \"");
    poVar1 = std::operator<<(poVar1,(string *)(plVar2 + 1));
    poVar1 = std::operator<<(poVar1,"\", type: \"");
    poVar1 = std::operator<<(poVar1,(string *)(plVar2 + 5));
    poVar1 = std::operator<<(poVar1,"\"");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void ChParserAdams::Report::Print() const {
    std::cout << "Parsed " << bodies.size() << " bodies:\n";
    for (auto const& body : bodies) {
        std::cout << "   name: \"" << body.first << "\"" << std::endl;
    }

    std::cout << "Parsed " << joints.size() << " joints:\n";
    for (auto const& joint : joints) {
        std::cout << "   name: \"" << joint.first << "\", type: \"" << joint.second.type << "\"" << std::endl;
    }
}